

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.h
# Opt level: O2

uint8_t * icu_63::BytesTrie::skipValue(uint8_t *pos)

{
  byte bVar1;
  uint8_t *puVar2;
  
  bVar1 = *pos;
  if (bVar1 < 0xa2) {
    return pos + 1;
  }
  if (bVar1 < 0xd8) {
    puVar2 = pos + 2;
  }
  else {
    if (0xfb < bVar1) {
      return pos + (ulong)((bVar1 >> 1 & 1) != 0) + 4;
    }
    puVar2 = pos + 3;
  }
  return puVar2;
}

Assistant:

static inline const uint8_t *skipValue(const uint8_t *pos) {
        int32_t leadByte=*pos++;
        return skipValue(pos, leadByte);
    }